

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<int_const,DenseIntMap<int>>,int,Hasher,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SelectKey,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>
::
copy_or_move_from<google::dense_hashtable<std::pair<int_const,DenseIntMap<int>>,int,Hasher,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SelectKey,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>>
          (dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
           *this,dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                 *ht,size_type min_buckets_wanted)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *this_00;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_RSI;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_RDI;
  size_type bucket_count_minus_one;
  size_type bucknum;
  size_type num_probes;
  pair<const_int,_DenseIntMap<int>_> *value;
  iterator __end0;
  iterator __begin0;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *__range3;
  pair<const_int,_DenseIntMap<int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_stack_ffffffffffffff90;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  local_38;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *local_20;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  ::size(in_RSI);
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)in_stack_ffffffffffffffc0,
             (size_type)in_stack_ffffffffffffffb8,(size_type)in_stack_ffffffffffffffb0);
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  ::clear_to_size(in_stack_ffffffffffffff90,
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_20 = local_10;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  ::begin(in_RDI);
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  ::end(in_RDI);
  while (bVar1 = dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                 ::operator!=(&local_38,(iterator *)&stack0xffffffffffffffb0), bVar1) {
    dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
    ::operator*(&local_38);
    sVar3 = dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
            ::bucket_count(in_RDI);
    this_00 = (dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
               *)(sVar3 - 1);
    iVar2 = get_key<std::pair<int_const,DenseIntMap<int>>&>(in_RDI,in_stack_ffffffffffffff78);
    dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
    ::hash<int>(in_RDI,&in_stack_ffffffffffffff78->first);
    do {
      bVar1 = dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
              ::test_empty(this_00,CONCAT44(iVar2,in_stack_ffffffffffffff88));
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    set_value<std::pair<int_const,DenseIntMap<int>>>
              (in_RDI,in_stack_ffffffffffffff78,(pair<const_int,_DenseIntMap<int>_> *)0x104534d);
    in_RDI->num_elements = in_RDI->num_elements + 1;
    dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
    ::operator++((dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                  *)in_RDI);
  }
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::inc_num_ht_copies
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)in_RDI);
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }